

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O2

int __thiscall OpenMD::IndexFinder::init(IndexFinder *this,EVP_PKEY_CTX *ctx)

{
  Molecule *pMVar1;
  Atom *pAVar2;
  RigidBody *pRVar3;
  Bond *pBVar4;
  Bend *pBVar5;
  Torsion *pTVar6;
  Inversion *pIVar7;
  Molecule *pMVar8;
  pointer ppAVar9;
  pointer ppRVar10;
  pointer ppBVar11;
  pointer ppBVar12;
  pointer ppTVar13;
  pointer ppIVar14;
  SelectionSet ss;
  MoleculeIterator mi;
  SelectionSet local_70;
  vector<int,_std::allocator<int>_> *local_58;
  MoleculeIterator local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_50._M_node = (_Base_ptr)0x0;
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_50);
  pMVar8 = (Molecule *)&this->nObjects_;
  local_58 = (vector<int,_std::allocator<int>_> *)pMVar8;
  while (pMVar1 != (Molecule *)0x0) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,local_58);
    SelectionSet::SelectionSet(&local_70,(vector<int,_std::allocator<int>_> *)&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    OpenMDBitSet::setBitOn
              (local_70.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start + 5,(long)pMVar1->globalIndex_);
    ppAVar9 = (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar9 !=
        (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_00210513;
    pAVar2 = (Atom *)0x0;
    while (pAVar2 != (Atom *)0x0) {
      OpenMDBitSet::setBitOn
                (local_70.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (long)(pAVar2->super_StuntDouble).globalIndex_);
      ppAVar9 = ppAVar9 + 1;
      pAVar2 = (Atom *)0x0;
      if (ppAVar9 !=
          (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00210513:
        pAVar2 = *ppAVar9;
      }
    }
    ppRVar10 = (pMVar1->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppRVar10 !=
        (pMVar1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021054f;
    pRVar3 = (RigidBody *)0x0;
    while (pRVar3 != (RigidBody *)0x0) {
      OpenMDBitSet::setBitOn
                (local_70.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (long)(pRVar3->super_StuntDouble).globalIndex_);
      ppRVar10 = ppRVar10 + 1;
      pRVar3 = (RigidBody *)0x0;
      if (ppRVar10 !=
          (pMVar1->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021054f:
        pRVar3 = *ppRVar10;
      }
    }
    ppBVar11 = (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar11 !=
        (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_00210586;
    pBVar4 = (Bond *)0x0;
    while (pBVar4 != (Bond *)0x0) {
      OpenMDBitSet::setBitOn
                (local_70.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1,
                 (long)(pBVar4->super_ShortRangeInteraction).globalIndex_);
      ppBVar11 = ppBVar11 + 1;
      pBVar4 = (Bond *)0x0;
      if (ppBVar11 !=
          (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00210586:
        pBVar4 = *ppBVar11;
      }
    }
    ppBVar12 = (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar12 !=
        (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_002105bd;
    pBVar5 = (Bend *)0x0;
    while (pBVar5 != (Bend *)0x0) {
      OpenMDBitSet::setBitOn
                (local_70.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start + 2,
                 (long)(pBVar5->super_ShortRangeInteraction).globalIndex_);
      ppBVar12 = ppBVar12 + 1;
      pBVar5 = (Bend *)0x0;
      if (ppBVar12 !=
          (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_002105bd:
        pBVar5 = *ppBVar12;
      }
    }
    ppTVar13 = (pMVar1->torsions_).
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppTVar13 !=
        (pMVar1->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_002105f4;
    pTVar6 = (Torsion *)0x0;
    while (pTVar6 != (Torsion *)0x0) {
      OpenMDBitSet::setBitOn
                (local_70.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start + 3,
                 (long)(pTVar6->super_ShortRangeInteraction).globalIndex_);
      ppTVar13 = ppTVar13 + 1;
      pTVar6 = (Torsion *)0x0;
      if (ppTVar13 !=
          (pMVar1->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_002105f4:
        pTVar6 = *ppTVar13;
      }
    }
    ppIVar14 = (pMVar1->inversions_).
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppIVar14 !=
        (pMVar1->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021062a;
    pIVar7 = (Inversion *)0x0;
    while (pIVar7 != (Inversion *)0x0) {
      OpenMDBitSet::setBitOn
                (local_70.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start + 4,
                 (long)(pIVar7->super_ShortRangeInteraction).globalIndex_);
      ppIVar14 = ppIVar14 + 1;
      pIVar7 = (Inversion *)0x0;
      if (ppIVar14 !=
          (pMVar1->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021062a:
        pIVar7 = *ppIVar14;
      }
    }
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
              (&(this->selectionSets_).
                super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                _M_impl.super__Vector_impl_data._M_start[pMVar1->globalIndex_].bitsets_,
               &local_70.bitsets_);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_70.bitsets_);
    pMVar8 = SimInfo::nextMolecule(this->info_,&local_50);
    pMVar1 = pMVar8;
  }
  return (int)pMVar8;
}

Assistant:

void IndexFinder::init() {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      SelectionSet ss(nObjects_);

      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }

      selectionSets_[mol->getGlobalIndex()] = ss;
    }
  }